

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

void __thiscall
sjtu::
map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
::insert(map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
         *this,Node *node)

{
  Node *pNVar1;
  Node *pNVar2;
  Node **ppNVar3;
  Node *pNVar4;
  
  pNVar1 = this->nil;
  pNVar2 = pNVar1;
  if (pNVar1->left != pNVar1) {
    pNVar4 = pNVar1->left;
    do {
      pNVar2 = pNVar4;
      pNVar4 = (&pNVar2->left)[pNVar2->value->first <= node->value->first];
    } while ((&pNVar2->left)[pNVar2->value->first <= node->value->first] != pNVar1);
    if ((pNVar2 != pNVar1) && (pNVar2->value->first <= node->value->first)) {
      ppNVar3 = &pNVar2->right;
      goto LAB_00116fea;
    }
  }
  ppNVar3 = &pNVar2->left;
LAB_00116fea:
  *ppNVar3 = node;
  node->right = pNVar1;
  node->left = pNVar1;
  node->parent = pNVar2;
  this->tot = this->tot + 1;
  insert_fixup(this,node);
  pNVar1 = this->nil;
  pNVar1->parent = pNVar1;
  pNVar2 = pNVar1;
  do {
    pNVar4 = pNVar2;
    pNVar2 = pNVar4->left;
  } while (pNVar2 != pNVar1);
  this->nodebegin = pNVar4;
  return;
}

Assistant:

void insert(Node * const node)//node -> color == RED
	{
		Node *x = nil -> left , *y = nil;
		for (;x != nil;y = x , x = compare(node -> value -> first , x -> value -> first) ? x -> left : x -> right);
		if (y == nil || compare(node -> value -> first , y -> value -> first)) y -> left = node;
		else y -> right = node;
		node -> left = node -> right = nil , node -> parent = y;
		++ tot , insert_fixup(node) , nil -> parent = nil , nodebegin = findmin(nil);
	}